

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O0

int skill_crosstrain_bonus(int skill)

{
  ushort uVar1;
  int iVar2;
  int local_24;
  int local_1c;
  int local_18;
  int i;
  int highest_skill;
  int base_skill;
  int skill_local;
  
  if ((skill < 1) || (0x1d < skill)) {
    base_skill = 1;
  }
  else {
    i = 1;
    for (local_1c = 4; 1 < local_1c; local_1c = local_1c + -1) {
      uVar1 = u.weapon_skills[skill].advance;
      iVar2 = practice_needed_to_advance(skill,local_1c + -1);
      if (iVar2 <= (int)(uint)uVar1) {
        i = local_1c;
        break;
      }
    }
    if (i < u.weapon_skills[skill].skill) {
      i = (int)u.weapon_skills[skill].skill;
    }
    local_18 = 0;
    for (local_1c = 1; local_1c < 0x1e; local_1c = local_1c + 1) {
      if (((local_1c != skill) &&
          ((weapon_skill_groups[skill + -1] & weapon_skill_groups[local_1c + -1]) != 0)) &&
         (local_18 < u.weapon_skills[local_1c].skill)) {
        local_18 = (int)u.weapon_skills[local_1c].skill;
      }
    }
    if ((local_18 - i) + 1 < 2) {
      local_24 = 1;
    }
    else {
      local_24 = (local_18 - i) + 1;
    }
    base_skill = local_24;
  }
  return base_skill;
}

Assistant:

static int skill_crosstrain_bonus(int skill)
{
    int base_skill, highest_skill, i;

    if (skill < P_FIRST_WEAPON || skill > P_LAST_WEAPON)
	return 1;

    /* find greatest skill level based solely on training points */
    base_skill = P_UNSKILLED;
    for (i = P_EXPERT; i > P_UNSKILLED; i--) {
	/* getting the training points for the _current_ level is awkward */
	if (P_ADVANCE(skill) >= practice_needed_to_advance(skill, i - 1)) {
	    base_skill = i;
	    break;
	}
    }
    /* if advancement level exceeds points (e.g. wizard mode), catch it too */
    if (base_skill < P_SKILL(skill))
	base_skill = P_SKILL(skill);

    /* find highest related weapon skill advancement */
    highest_skill = P_ISRESTRICTED;
    for (i = P_FIRST_WEAPON; i <= P_LAST_WEAPON; i++) {
	if (i == skill)
	    continue;
	if ((weapon_skill_groups[skill - P_FIRST_WEAPON] &
	     weapon_skill_groups[i - P_FIRST_WEAPON]) == 0)
	    continue;
	if (P_SKILL(i) > highest_skill)
	    highest_skill = P_SKILL(i);
    }

    return max(highest_skill - base_skill + 1, 1);
}